

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>::
     Execute<duckdb::string_t,duckdb::string_t,duckdb::ArgMinMaxState<duckdb::string_t,duckdb::string_t>>
               (ArgMinMaxState<duckdb::string_t,_duckdb::string_t> *state,string_t x_data,
               string_t y_data,AggregateBinaryInput *binary)

{
  bool bVar1;
  anon_union_16_2_67f50693_for_value local_30;
  anon_union_16_2_67f50693_for_value local_20;
  
  local_30.pointer.ptr = (char *)y_data.value._8_8_;
  local_30._0_8_ = y_data.value._0_8_;
  local_20.pointer.ptr = (char *)x_data.value._8_8_;
  local_20._0_8_ = x_data.value._0_8_;
  bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                    (&binary->right_mask->super_TemplatedValidityMask<unsigned_long>,binary->ridx);
  if (bVar1) {
    bVar1 = string_t::StringComparisonOperators::GreaterThan
                      ((string_t *)&local_30.pointer,&state->value);
    if (bVar1) {
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&binary->left_mask->super_TemplatedValidityMask<unsigned_long>,binary->lidx
                        );
      Assign<duckdb::string_t,duckdb::string_t,duckdb::ArgMinMaxState<duckdb::string_t,duckdb::string_t>>
                (state,(string_t *)&local_20.pointer,(string_t *)&local_30.pointer,!bVar1);
    }
  }
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}